

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  string url;
  string local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = ConsumeIdentifier(this,prefix);
  if (bVar1) {
    local_58 = full_type_name;
    while( true ) {
      std::__cxx11::string::string((string *)&local_78,".",(allocator *)&local_50);
      bVar1 = TryConsume(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (!bVar1) break;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeIdentifier(this,&local_78);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_78);
        return false;
      }
      std::operator+(&local_50,".",&local_78);
      std::__cxx11::string::append((string *)prefix);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::string((string *)&local_78,"/",(allocator *)&local_50);
    bVar1 = Consume(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      std::__cxx11::string::append((char *)prefix);
      bVar1 = ConsumeFullTypeName(this,local_58);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      *prefix += "." + url;
    }
    DO(Consume("/"));
    *prefix += "/";
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }